

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalctocsv.cpp
# Opt level: O0

void help(void)

{
  fprintf(_stderr,
          "-s skip header\n-f full precision\n-e show exposure_value\n-v version\n-a include MaxLoss sample IDs\n-z remove records with zero exposure values\n-o Open Results Data (ORD) output\n-p [filename] ORD output in parquet format\n-h help\n"
         );
  return;
}

Assistant:

void help()
{
	fprintf(stderr,
		"-s skip header\n"
		"-f full precision\n"
		"-e show exposure_value\n"
		"-v version\n"
		"-a include MaxLoss sample IDs\n"
		"-z remove records with zero exposure values\n"
		"-o Open Results Data (ORD) output\n"
		"-p [filename] ORD output in parquet format\n"
		"-h help\n"
	);
}